

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O2

uint __thiscall QVariant::toUInt(QVariant *this,bool *ok)

{
  uint uVar1;
  
  uVar1 = qNumVariantToHelper<unsigned_int>(&this->d,ok);
  return uVar1;
}

Assistant:

uint QVariant::toUInt(bool *ok) const
{
    return qNumVariantToHelper<uint>(d, ok);
}